

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O0

size_t embree::os_shrink(void *ptr,size_t bytesNew,size_t bytesOld,bool hugepages)

{
  int iVar1;
  bad_alloc *this;
  ulong uVar2;
  undefined8 uVar3;
  byte in_CL;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t pageSize;
  ulong local_8;
  
  iVar1 = 0x1000;
  if ((in_CL & 1) != 0) {
    iVar1 = 0x200000;
  }
  this = (bad_alloc *)(long)iVar1;
  uVar2 = (ulong)(this + in_RSI + -1) & ((ulong)(this + -1) ^ 0xffffffffffffffff);
  local_8 = (ulong)(this + in_RDX + -1) & ((ulong)(this + -1) ^ 0xffffffffffffffff);
  if ((uVar2 < local_8) &&
     (iVar1 = munmap((void *)(in_RDI + uVar2),local_8 - uVar2), local_8 = uVar2, iVar1 == -1)) {
    uVar3 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this);
    __cxa_throw(uVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return local_8;
}

Assistant:

size_t os_shrink(void* ptr, size_t bytesNew, size_t bytesOld, bool hugepages) 
  {
    const size_t pageSize = hugepages ? PAGE_SIZE_2M : PAGE_SIZE_4K;
    bytesNew = (bytesNew+pageSize-1) & ~(pageSize-1);
    bytesOld = (bytesOld+pageSize-1) & ~(pageSize-1);
    if (bytesNew >= bytesOld)
      return bytesOld;

    if (munmap((char*)ptr+bytesNew,bytesOld-bytesNew) == -1)
      throw std::bad_alloc();

    return bytesNew;
  }